

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O1

session_params *
libtorrent::read_session_params
          (session_params *__return_storage_ptr__,bdecode_node *e,save_state_flags_t flags)

{
  undefined8 uVar1;
  pointer ppVar2;
  bool bVar3;
  type_t tVar4;
  long lVar5;
  settings_pack *psVar6;
  dht_settings *pdVar7;
  byte bVar8;
  string_view key;
  string_view key_00;
  string_view key_01;
  bdecode_node settings;
  settings_pack local_b8;
  undefined1 local_68 [16];
  pointer local_58;
  undefined4 uStack_50;
  undefined4 local_4c;
  pointer ppStack_48;
  int iStack_40;
  int local_3c;
  pointer ppStack_38;
  int iStack_30;
  
  bVar8 = 0;
  session_params::session_params(__return_storage_ptr__);
  ppStack_48 = (pointer)0x0;
  iStack_40 = 0;
  local_58 = (pointer)0x0;
  uStack_50 = 0;
  local_4c = 0;
  local_68 = (undefined1  [16])0x0;
  local_3c = -1;
  ppStack_38 = (pointer)0xffffffffffffffff;
  iStack_30 = -1;
  tVar4 = bdecode_node::type(e);
  if (tVar4 == dict_t) {
    if ((flags.m_val & 1) != 0) {
      key.len_ = 8;
      key.ptr_ = "settings";
      bdecode_node::dict_find_dict((bdecode_node *)&local_b8,e,key);
      ppVar2 = local_58;
      uVar1 = local_68._0_8_;
      local_68._8_8_ =
           local_b8.m_strings.
           super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_68._0_8_ =
           local_b8.m_strings.
           super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_58 = local_b8.m_strings.
                 super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_b8.m_strings.
      super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.m_strings.
      super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.m_strings.
      super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pointer)uVar1 != (pointer)0x0) {
        operator_delete((void *)uVar1,(long)ppVar2 - uVar1);
      }
      iStack_30 = (int)local_b8.m_bools.
                       super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
      iStack_40 = (int)local_b8.m_ints.
                       super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3c = (int)((ulong)local_b8.m_ints.
                              super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
      ppStack_38 = local_b8.m_bools.
                   super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      uStack_50 = SUB84(local_b8.m_ints.
                        super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,0);
      local_4c = (undefined4)
                 ((ulong)local_b8.m_ints.
                         super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 0x20);
      ppStack_48 = local_b8.m_ints.
                   super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      if (local_b8.m_strings.
          super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.m_strings.
                        super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.m_strings.
                              super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.m_strings.
                              super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_68);
      if (bVar3) {
        load_pack_from_dict(&local_b8,(bdecode_node *)local_68);
        settings_pack::operator=(&__return_storage_ptr__->settings,&local_b8);
        if (local_b8.m_bools.
            super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.m_bools.
                          super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.m_bools.
                                super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.m_bools.
                                super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b8.m_ints.
            super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.m_ints.
                          super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.m_ints.
                                super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.m_ints.
                                super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_b8.m_strings);
      }
    }
    if ((flags.m_val & 2) != 0) {
      key_00.len_ = 3;
      key_00.ptr_ = "dht";
      bdecode_node::dict_find_dict((bdecode_node *)&local_b8,e,key_00);
      ppVar2 = local_58;
      uVar1 = local_68._0_8_;
      local_68._8_8_ =
           local_b8.m_strings.
           super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_68._0_8_ =
           local_b8.m_strings.
           super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_58 = local_b8.m_strings.
                 super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_b8.m_strings.
      super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.m_strings.
      super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.m_strings.
      super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pointer)uVar1 != (pointer)0x0) {
        operator_delete((void *)uVar1,(long)ppVar2 - uVar1);
      }
      iStack_30 = (int)local_b8.m_bools.
                       super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
      iStack_40 = (int)local_b8.m_ints.
                       super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3c = (int)((ulong)local_b8.m_ints.
                              super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
      ppStack_38 = local_b8.m_bools.
                   super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      uStack_50 = SUB84(local_b8.m_ints.
                        super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,0);
      local_4c = (undefined4)
                 ((ulong)local_b8.m_ints.
                         super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 0x20);
      ppStack_48 = local_b8.m_ints.
                   super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      if (local_b8.m_strings.
          super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.m_strings.
                        super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.m_strings.
                              super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.m_strings.
                              super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_68);
      if (bVar3) {
        dht::read_dht_settings((dht_settings *)&local_b8,(bdecode_node *)local_68);
        psVar6 = &local_b8;
        pdVar7 = &__return_storage_ptr__->dht_settings;
        for (lVar5 = 0x11; lVar5 != 0; lVar5 = lVar5 + -1) {
          pdVar7->max_peers_reply = *(int *)psVar6;
          psVar6 = (settings_pack *)((long)psVar6 + ((ulong)bVar8 * -2 + 1) * 4);
          pdVar7 = (dht_settings *)((long)pdVar7 + (ulong)bVar8 * -8 + 4);
        }
      }
    }
    if ((flags.m_val & 4) != 0) {
      key_01.len_ = 9;
      key_01.ptr_ = "dht state";
      bdecode_node::dict_find_dict((bdecode_node *)&local_b8,e,key_01);
      ppVar2 = local_58;
      uVar1 = local_68._0_8_;
      local_68._8_8_ =
           local_b8.m_strings.
           super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_68._0_8_ =
           local_b8.m_strings.
           super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_58 = local_b8.m_strings.
                 super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_b8.m_strings.
      super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.m_strings.
      super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.m_strings.
      super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pointer)uVar1 != (pointer)0x0) {
        operator_delete((void *)uVar1,(long)ppVar2 - uVar1);
      }
      iStack_30 = (int)local_b8.m_bools.
                       super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
      iStack_40 = (int)local_b8.m_ints.
                       super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_3c = (int)((ulong)local_b8.m_ints.
                              super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
      ppStack_38 = local_b8.m_bools.
                   super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      uStack_50 = SUB84(local_b8.m_ints.
                        super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,0);
      local_4c = (undefined4)
                 ((ulong)local_b8.m_ints.
                         super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 0x20);
      ppStack_48 = local_b8.m_ints.
                   super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      if (local_b8.m_strings.
          super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.m_strings.
                        super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_b8.m_strings.
                              super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.m_strings.
                              super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar3 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_68);
      if (bVar3) {
        dht::read_dht_state((dht_state *)&local_b8,(bdecode_node *)local_68);
        std::
        vector<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
        ::_M_move_assign(&(__return_storage_ptr__->dht_state).nids,&local_b8);
        std::
        vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
        ::_M_move_assign(&(__return_storage_ptr__->dht_state).nodes,&local_b8.m_ints);
        std::
        vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
        ::_M_move_assign(&(__return_storage_ptr__->dht_state).nodes6,&local_b8.m_bools);
        if (local_b8.m_bools.
            super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.m_bools.
                          super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.m_bools.
                                super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.m_bools.
                                super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b8.m_ints.
            super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.m_ints.
                          super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.m_ints.
                                super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.m_ints.
                                super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b8.m_strings.
            super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.m_strings.
                          super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.m_strings.
                                super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.m_strings.
                                super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
      }
    }
  }
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_68._0_8_,(long)local_58 - local_68._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

session_params read_session_params(bdecode_node const& e, save_state_flags_t const flags)
	{
		session_params params;

		bdecode_node settings;
		if (e.type() != bdecode_node::dict_t) return params;

		if (flags & session_handle::save_settings)
		{
			settings = e.dict_find_dict("settings");
			if (settings)
			{
				params.settings = load_pack_from_dict(settings);
			}
		}

#ifndef TORRENT_DISABLE_DHT
		if (flags & session_handle::save_dht_settings)
		{
			settings = e.dict_find_dict("dht");
			if (settings)
			{
				params.dht_settings = dht::read_dht_settings(settings);
			}
		}

		if (flags & session_handle::save_dht_state)
		{
			settings = e.dict_find_dict("dht state");
			if (settings)
			{
				params.dht_state = dht::read_dht_state(settings);
			}
		}
#endif

		return params;
	}